

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

ecs_entity_t ecs_lookup(ecs_world_t *world,char *name)

{
  _Bool _Var1;
  ecs_entity_t e;
  char *name_local;
  ecs_world_t *world_local;
  
  if (name == (char *)0x0) {
    world_local = (ecs_world_t *)0x0;
  }
  else {
    _Var1 = is_number(name);
    if (_Var1) {
      world_local = (ecs_world_t *)name_to_id(name);
    }
    else {
      world_local = (ecs_world_t *)find_as_alias(world,name);
      if (world_local == (ecs_world_t *)0x0) {
        world_local = (ecs_world_t *)ecs_lookup_child(world,0,name);
      }
    }
  }
  return (ecs_entity_t)world_local;
}

Assistant:

ecs_entity_t ecs_lookup(
    ecs_world_t *world,
    const char *name)
{   
    if (!name) {
        return 0;
    }

    if (is_number(name)) {
        return name_to_id(name);
    }

    ecs_entity_t e = find_as_alias(world, name);
    if (e) {
        return e;
    }    
    
    return ecs_lookup_child(world, 0, name);
}